

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::ReferenceContext
          (ReferenceContext *this,ReferenceContextLimits *limits,
          MultisamplePixelBufferAccess *colorbuffer,MultisamplePixelBufferAccess *depthbuffer,
          MultisamplePixelBufferAccess *stencilbuffer)

{
  CubeFace face_00;
  bool bVar1;
  int iVar2;
  int w_;
  ContextType type;
  ConstPixelBufferAccess *pCVar3;
  Sampler *pSVar4;
  PixelBufferAccess *pPVar5;
  StencilState *local_1c8;
  Vector<float,_4> local_104;
  int local_f4;
  int faceNdx;
  Vector<float,_4> local_e8;
  TextureFormat local_d8;
  Vector<float,_4> local_d0;
  TextureFormat local_c0;
  Vector<float,_4> local_b8;
  TextureFormat local_a8;
  CubeFace local_a0;
  int face;
  TextureFormat local_8c;
  Vector<float,_4> local_84;
  TextureFormat local_74;
  allocator<rr::GenericVec4> local_69;
  Vector<float,_4> local_68;
  GenericVec4 local_58;
  allocator<sglr::ReferenceContext::TextureUnit> local_45 [17];
  ApiType local_34;
  MultisamplePixelBufferAccess *local_30;
  MultisamplePixelBufferAccess *stencilbuffer_local;
  MultisamplePixelBufferAccess *depthbuffer_local;
  MultisamplePixelBufferAccess *colorbuffer_local;
  ReferenceContextLimits *limits_local;
  ReferenceContext *this_local;
  
  local_34.m_bits = (limits->contextType).super_ApiType.m_bits;
  local_30 = stencilbuffer;
  stencilbuffer_local = depthbuffer;
  depthbuffer_local = colorbuffer;
  colorbuffer_local = (MultisamplePixelBufferAccess *)limits;
  limits_local = (ReferenceContextLimits *)this;
  Context::Context(&this->super_Context,(ContextType)local_34.m_bits);
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__ReferenceContext_00cbc580;
  ReferenceContextLimits::ReferenceContextLimits
            (&this->m_limits,(ReferenceContextLimits *)colorbuffer_local);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            (&this->m_defaultColorbuffer,depthbuffer_local);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            (&this->m_defaultDepthbuffer,stencilbuffer_local);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            (&this->m_defaultStencilbuffer,local_30);
  rc::VertexArray::VertexArray(&this->m_clientVertexArray,0,(this->m_limits).maxVertexAttribs);
  pCVar3 = &rr::MultisamplePixelBufferAccess::raw(depthbuffer_local)->super_ConstPixelBufferAccess;
  iVar2 = tcu::ConstPixelBufferAccess::getHeight(pCVar3);
  pCVar3 = &rr::MultisamplePixelBufferAccess::raw(depthbuffer_local)->super_ConstPixelBufferAccess;
  w_ = tcu::ConstPixelBufferAccess::getDepth(pCVar3);
  tcu::Vector<int,_4>::Vector(&this->m_viewport,0,0,iVar2,w_);
  rc::ObjectManager<sglr::rc::Texture>::ObjectManager(&this->m_textures);
  rc::ObjectManager<sglr::rc::Framebuffer>::ObjectManager(&this->m_framebuffers);
  rc::ObjectManager<sglr::rc::Renderbuffer>::ObjectManager(&this->m_renderbuffers);
  rc::ObjectManager<sglr::rc::DataBuffer>::ObjectManager(&this->m_buffers);
  rc::ObjectManager<sglr::rc::VertexArray>::ObjectManager(&this->m_vertexArrays);
  rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::ObjectManager(&this->m_programs);
  this->m_activeTexture = 0;
  iVar2 = (this->m_limits).maxTextureImageUnits;
  std::allocator<sglr::ReferenceContext::TextureUnit>::allocator(local_45);
  std::
  vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
  ::vector(&this->m_textureUnits,(long)iVar2,local_45);
  std::allocator<sglr::ReferenceContext::TextureUnit>::~allocator(local_45);
  rc::Texture1D::Texture1D(&this->m_emptyTex1D,0);
  rc::Texture2D::Texture2D(&this->m_emptyTex2D,0);
  rc::TextureCube::TextureCube(&this->m_emptyTexCube,0);
  rc::Texture2DArray::Texture2DArray(&this->m_emptyTex2DArray,0);
  rc::Texture3D::Texture3D(&this->m_emptyTex3D,0);
  rc::TextureCubeArray::TextureCubeArray(&this->m_emptyTexCubeArray,0);
  this->m_pixelUnpackRowLength = 0;
  this->m_pixelUnpackSkipRows = 0;
  this->m_pixelUnpackSkipPixels = 0;
  this->m_pixelUnpackImageHeight = 0;
  this->m_pixelUnpackSkipImages = 0;
  this->m_pixelUnpackAlignment = 4;
  this->m_pixelPackAlignment = 4;
  this->m_readFramebufferBinding = (Framebuffer *)0x0;
  this->m_drawFramebufferBinding = (Framebuffer *)0x0;
  this->m_renderbufferBinding = (Renderbuffer *)0x0;
  this->m_vertexArrayBinding = (VertexArray *)0x0;
  this->m_currentProgram = (ShaderProgramObjectContainer *)0x0;
  this->m_arrayBufferBinding = (DataBuffer *)0x0;
  this->m_pixelPackBufferBinding = (DataBuffer *)0x0;
  this->m_pixelUnpackBufferBinding = (DataBuffer *)0x0;
  this->m_transformFeedbackBufferBinding = (DataBuffer *)0x0;
  this->m_uniformBufferBinding = (DataBuffer *)0x0;
  this->m_copyReadBufferBinding = (DataBuffer *)0x0;
  this->m_copyWriteBufferBinding = (DataBuffer *)0x0;
  this->m_drawIndirectBufferBinding = (DataBuffer *)0x0;
  tcu::Vector<float,_4>::Vector(&this->m_clearColor,0.0,0.0,0.0,0.0);
  this->m_clearDepth = 1.0;
  this->m_clearStencil = 0;
  this->m_scissorEnabled = false;
  tcu::Vector<int,_4>::Vector(&this->m_scissorBox,&this->m_viewport);
  this->m_stencilTestEnabled = false;
  local_1c8 = this->m_stencil;
  do {
    StencilState::StencilState(local_1c8);
    local_1c8 = local_1c8 + 1;
  } while (local_1c8 != (StencilState *)&this->m_depthTestEnabled);
  this->m_depthTestEnabled = false;
  this->m_depthFunc = 0x201;
  this->m_depthRangeNear = 0.0;
  this->m_depthRangeFar = 1.0;
  this->m_polygonOffsetFactor = 0.0;
  this->m_polygonOffsetUnits = 0.0;
  this->m_polygonOffsetFillEnabled = false;
  this->m_provokingFirstVertexConvention = false;
  this->m_blendEnabled = false;
  this->m_blendModeRGB = 0x8006;
  this->m_blendModeAlpha = 0x8006;
  this->m_blendFactorSrcRGB = 1;
  this->m_blendFactorDstRGB = 0;
  this->m_blendFactorSrcAlpha = 1;
  this->m_blendFactorDstAlpha = 0;
  tcu::Vector<float,_4>::Vector(&this->m_blendColor,0.0,0.0,0.0,0.0);
  this->m_sRGBUpdateEnabled = true;
  this->m_depthClampEnabled = false;
  tcu::Vector<bool,_4>::Vector(&this->m_colorMask,true,true,true,true);
  this->m_depthMask = true;
  iVar2 = (this->m_limits).maxVertexAttribs;
  tcu::Vector<float,_4>::Vector(&local_68,0.0,0.0,0.0,1.0);
  rr::GenericVec4::GenericVec4<float>(&local_58,&local_68);
  std::allocator<rr::GenericVec4>::allocator(&local_69);
  std::vector<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::vector
            (&this->m_currentAttribs,(long)iVar2,&local_58,&local_69);
  std::allocator<rr::GenericVec4>::~allocator(&local_69);
  this->m_lineWidth = 1.0;
  this->m_primitiveRestartFixedIndex = false;
  this->m_primitiveRestartSettableIndex = false;
  this->m_primitiveRestartIndex = 0;
  this->m_lastError = 0;
  rr::FragmentProcessor::FragmentProcessor(&this->m_fragmentProcessor);
  std::vector<rr::Fragment,_std::allocator<rr::Fragment>_>::vector(&this->m_fragmentBuffer);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_fragmentDepths);
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex1D).super_Texture);
  pSVar4->wrapS = CLAMP_TO_EDGE;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex1D).super_Texture);
  pSVar4->wrapT = CLAMP_TO_EDGE;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex1D).super_Texture);
  pSVar4->minFilter = NEAREST;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex1D).super_Texture);
  pSVar4->magFilter = NEAREST;
  tcu::TextureFormat::TextureFormat(&local_74,RGBA,UNORM_INT8);
  rc::Texture1D::allocLevel(&this->m_emptyTex1D,0,&local_74,1);
  pPVar5 = rc::Texture1D::getLevel(&this->m_emptyTex1D,0);
  tcu::Vector<float,_4>::Vector(&local_84,0.0,0.0,0.0,1.0);
  tcu::PixelBufferAccess::setPixel(pPVar5,&local_84,0,0,0);
  rc::Texture1D::updateView(&this->m_emptyTex1D,MODE_LAST);
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex2D).super_Texture);
  pSVar4->wrapS = CLAMP_TO_EDGE;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex2D).super_Texture);
  pSVar4->wrapT = CLAMP_TO_EDGE;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex2D).super_Texture);
  pSVar4->minFilter = NEAREST;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex2D).super_Texture);
  pSVar4->magFilter = NEAREST;
  tcu::TextureFormat::TextureFormat(&local_8c,RGBA,UNORM_INT8);
  rc::Texture2D::allocLevel(&this->m_emptyTex2D,0,&local_8c,1,1);
  pPVar5 = rc::Texture2D::getLevel(&this->m_emptyTex2D,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xffffffffffffff64,0.0,0.0,0.0,1.0);
  tcu::PixelBufferAccess::setPixel(pPVar5,(Vec4 *)&stack0xffffffffffffff64,0,0,0);
  rc::Texture2D::updateView(&this->m_emptyTex2D,MODE_LAST);
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTexCube).super_Texture);
  pSVar4->wrapS = CLAMP_TO_EDGE;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTexCube).super_Texture);
  pSVar4->wrapT = CLAMP_TO_EDGE;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTexCube).super_Texture);
  pSVar4->minFilter = NEAREST;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTexCube).super_Texture);
  pSVar4->magFilter = NEAREST;
  for (local_a0 = CUBEFACE_NEGATIVE_X; face_00 = local_a0, (int)local_a0 < 6;
      local_a0 = local_a0 + CUBEFACE_POSITIVE_X) {
    tcu::TextureFormat::TextureFormat(&local_a8,RGBA,UNORM_INT8);
    rc::TextureCube::allocFace(&this->m_emptyTexCube,0,face_00,&local_a8,1,1);
    pPVar5 = rc::TextureCube::getFace(&this->m_emptyTexCube,0,local_a0);
    tcu::Vector<float,_4>::Vector(&local_b8,0.0,0.0,0.0,1.0);
    tcu::PixelBufferAccess::setPixel(pPVar5,&local_b8,0,0,0);
  }
  rc::TextureCube::updateView(&this->m_emptyTexCube,MODE_LAST);
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex2DArray).super_Texture);
  pSVar4->wrapS = CLAMP_TO_EDGE;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex2DArray).super_Texture);
  pSVar4->wrapT = CLAMP_TO_EDGE;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex2DArray).super_Texture);
  pSVar4->minFilter = NEAREST;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex2DArray).super_Texture);
  pSVar4->magFilter = NEAREST;
  tcu::TextureFormat::TextureFormat(&local_c0,RGBA,UNORM_INT8);
  rc::Texture2DArray::allocLevel(&this->m_emptyTex2DArray,0,&local_c0,1,1,1);
  pPVar5 = rc::Texture2DArray::getLevel(&this->m_emptyTex2DArray,0);
  tcu::Vector<float,_4>::Vector(&local_d0,0.0,0.0,0.0,1.0);
  tcu::PixelBufferAccess::setPixel(pPVar5,&local_d0,0,0,0);
  rc::Texture2DArray::updateView(&this->m_emptyTex2DArray,MODE_LAST);
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex3D).super_Texture);
  pSVar4->wrapS = CLAMP_TO_EDGE;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex3D).super_Texture);
  pSVar4->wrapT = CLAMP_TO_EDGE;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex3D).super_Texture);
  pSVar4->wrapR = CLAMP_TO_EDGE;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex3D).super_Texture);
  pSVar4->minFilter = NEAREST;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTex3D).super_Texture);
  pSVar4->magFilter = NEAREST;
  tcu::TextureFormat::TextureFormat(&local_d8,RGBA,UNORM_INT8);
  rc::Texture3D::allocLevel(&this->m_emptyTex3D,0,&local_d8,1,1,1);
  pPVar5 = rc::Texture3D::getLevel(&this->m_emptyTex3D,0);
  tcu::Vector<float,_4>::Vector(&local_e8,0.0,0.0,0.0,1.0);
  tcu::PixelBufferAccess::setPixel(pPVar5,&local_e8,0,0,0);
  rc::Texture3D::updateView(&this->m_emptyTex3D,MODE_LAST);
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTexCubeArray).super_Texture);
  pSVar4->wrapS = CLAMP_TO_EDGE;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTexCubeArray).super_Texture);
  pSVar4->wrapT = CLAMP_TO_EDGE;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTexCubeArray).super_Texture);
  pSVar4->minFilter = NEAREST;
  pSVar4 = rc::Texture::getSampler(&(this->m_emptyTexCubeArray).super_Texture);
  pSVar4->magFilter = NEAREST;
  tcu::TextureFormat::TextureFormat((TextureFormat *)&stack0xffffffffffffff10,RGBA,UNORM_INT8);
  rc::TextureCubeArray::allocLevel
            (&this->m_emptyTexCubeArray,0,(TextureFormat *)&stack0xffffffffffffff10,1,1,6);
  for (local_f4 = 0; local_f4 < 6; local_f4 = local_f4 + 1) {
    pPVar5 = rc::TextureCubeArray::getLevel(&this->m_emptyTexCubeArray,0);
    tcu::Vector<float,_4>::Vector(&local_104,0.0,0.0,0.0,1.0);
    tcu::PixelBufferAccess::setPixel(pPVar5,&local_104,0,0,local_f4);
  }
  rc::TextureCubeArray::updateView(&this->m_emptyTexCubeArray,MODE_LAST);
  type = Context::getType(&this->super_Context);
  bVar1 = glu::isContextTypeGLCore(type);
  if (bVar1) {
    this->m_sRGBUpdateEnabled = false;
  }
  return;
}

Assistant:

ReferenceContext::ReferenceContext (const ReferenceContextLimits& limits, const rr::MultisamplePixelBufferAccess& colorbuffer, const rr::MultisamplePixelBufferAccess& depthbuffer, const rr::MultisamplePixelBufferAccess& stencilbuffer)
	: Context							(limits.contextType)
	, m_limits							(limits)
	, m_defaultColorbuffer				(colorbuffer)
	, m_defaultDepthbuffer				(depthbuffer)
	, m_defaultStencilbuffer			(stencilbuffer)
	, m_clientVertexArray				(0, m_limits.maxVertexAttribs)

	, m_viewport						(0, 0, colorbuffer.raw().getHeight(), colorbuffer.raw().getDepth())

	, m_activeTexture					(0)
	, m_textureUnits					(m_limits.maxTextureImageUnits)
	, m_emptyTex1D						()
	, m_emptyTex2D						()
	, m_emptyTexCube					()
	, m_emptyTex2DArray					()
	, m_emptyTex3D						()
	, m_emptyTexCubeArray				()

	, m_pixelUnpackRowLength			(0)
	, m_pixelUnpackSkipRows				(0)
	, m_pixelUnpackSkipPixels			(0)
	, m_pixelUnpackImageHeight			(0)
	, m_pixelUnpackSkipImages			(0)
	, m_pixelUnpackAlignment			(4)
	, m_pixelPackAlignment				(4)

	, m_readFramebufferBinding			(DE_NULL)
	, m_drawFramebufferBinding			(DE_NULL)
	, m_renderbufferBinding				(DE_NULL)
	, m_vertexArrayBinding				(DE_NULL)
	, m_currentProgram					(DE_NULL)

	, m_arrayBufferBinding				(DE_NULL)
	, m_pixelPackBufferBinding			(DE_NULL)
	, m_pixelUnpackBufferBinding		(DE_NULL)
	, m_transformFeedbackBufferBinding	(DE_NULL)
	, m_uniformBufferBinding			(DE_NULL)
	, m_copyReadBufferBinding			(DE_NULL)
	, m_copyWriteBufferBinding			(DE_NULL)
	, m_drawIndirectBufferBinding		(DE_NULL)

	, m_clearColor						(0.0f, 0.0f, 0.0f, 0.0f)
	, m_clearDepth						(1.0f)
	, m_clearStencil					(0)
	, m_scissorEnabled					(false)
	, m_scissorBox						(m_viewport)
	, m_stencilTestEnabled				(false)
	, m_depthTestEnabled				(false)
	, m_depthFunc						(GL_LESS)
	, m_depthRangeNear					(0.0f)
	, m_depthRangeFar					(1.0f)
	, m_polygonOffsetFactor				(0.0f)
	, m_polygonOffsetUnits				(0.0f)
	, m_polygonOffsetFillEnabled		(false)
	, m_provokingFirstVertexConvention	(false)
	, m_blendEnabled					(false)
	, m_blendModeRGB					(GL_FUNC_ADD)
	, m_blendModeAlpha					(GL_FUNC_ADD)
	, m_blendFactorSrcRGB				(GL_ONE)
	, m_blendFactorDstRGB				(GL_ZERO)
	, m_blendFactorSrcAlpha				(GL_ONE)
	, m_blendFactorDstAlpha				(GL_ZERO)
	, m_blendColor						(0.0f, 0.0f, 0.0f, 0.0f)
	, m_sRGBUpdateEnabled				(true)
	, m_depthClampEnabled				(false)
	, m_colorMask						(true, true, true, true)
	, m_depthMask						(true)
	, m_currentAttribs					(m_limits.maxVertexAttribs, rr::GenericVec4(tcu::Vec4(0, 0, 0, 1)))
	, m_lineWidth						(1.0f)
	, m_primitiveRestartFixedIndex		(false)
	, m_primitiveRestartSettableIndex	(false)
	, m_primitiveRestartIndex			(0)

	, m_lastError						(GL_NO_ERROR)
{
	// Create empty textures to be used when texture objects are incomplete.
	m_emptyTex1D.getSampler().wrapS		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex1D.getSampler().wrapT		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex1D.getSampler().minFilter	= tcu::Sampler::NEAREST;
	m_emptyTex1D.getSampler().magFilter	= tcu::Sampler::NEAREST;
	m_emptyTex1D.allocLevel(0, tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1);
	m_emptyTex1D.getLevel(0).setPixel(Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0, 0);
	m_emptyTex1D.updateView(tcu::Sampler::MODE_LAST);

	m_emptyTex2D.getSampler().wrapS		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex2D.getSampler().wrapT		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex2D.getSampler().minFilter	= tcu::Sampler::NEAREST;
	m_emptyTex2D.getSampler().magFilter	= tcu::Sampler::NEAREST;
	m_emptyTex2D.allocLevel(0, tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1);
	m_emptyTex2D.getLevel(0).setPixel(Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0, 0);
	m_emptyTex2D.updateView(tcu::Sampler::MODE_LAST);

	m_emptyTexCube.getSampler().wrapS		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTexCube.getSampler().wrapT		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTexCube.getSampler().minFilter	= tcu::Sampler::NEAREST;
	m_emptyTexCube.getSampler().magFilter	= tcu::Sampler::NEAREST;
	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		m_emptyTexCube.allocFace(0, (tcu::CubeFace)face, tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1);
		m_emptyTexCube.getFace(0, (tcu::CubeFace)face).setPixel(Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0, 0);
	}
	m_emptyTexCube.updateView(tcu::Sampler::MODE_LAST);

	m_emptyTex2DArray.getSampler().wrapS		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex2DArray.getSampler().wrapT		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex2DArray.getSampler().minFilter	= tcu::Sampler::NEAREST;
	m_emptyTex2DArray.getSampler().magFilter	= tcu::Sampler::NEAREST;
	m_emptyTex2DArray.allocLevel(0, tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1, 1);
	m_emptyTex2DArray.getLevel(0).setPixel(Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0, 0);
	m_emptyTex2DArray.updateView(tcu::Sampler::MODE_LAST);

	m_emptyTex3D.getSampler().wrapS		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex3D.getSampler().wrapT		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex3D.getSampler().wrapR		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTex3D.getSampler().minFilter	= tcu::Sampler::NEAREST;
	m_emptyTex3D.getSampler().magFilter	= tcu::Sampler::NEAREST;
	m_emptyTex3D.allocLevel(0, tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1, 1);
	m_emptyTex3D.getLevel(0).setPixel(Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0, 0);
	m_emptyTex3D.updateView(tcu::Sampler::MODE_LAST);

	m_emptyTexCubeArray.getSampler().wrapS		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTexCubeArray.getSampler().wrapT		= tcu::Sampler::CLAMP_TO_EDGE;
	m_emptyTexCubeArray.getSampler().minFilter	= tcu::Sampler::NEAREST;
	m_emptyTexCubeArray.getSampler().magFilter	= tcu::Sampler::NEAREST;
	m_emptyTexCubeArray.allocLevel(0, tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1, 6);
	for (int faceNdx = 0; faceNdx < 6; faceNdx++)
		m_emptyTexCubeArray.getLevel(0).setPixel(Vec4(0.0f, 0.0f, 0.0f, 1.0f), 0, 0, faceNdx);
	m_emptyTexCubeArray.updateView(tcu::Sampler::MODE_LAST);

	if (glu::isContextTypeGLCore(getType()))
		m_sRGBUpdateEnabled = false;
}